

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_> __thiscall
Editor::makeCommand<commands::ToggleTiles,Board&,bool>(Editor *this,Board *args,bool *args_1)

{
  uint uVar1;
  size_type sVar2;
  Command *pCVar3;
  rep rVar4;
  unsigned_long uVar5;
  bool *in_RSI;
  tuple<commands::ToggleTiles_*,_std::default_delete<commands::ToggleTiles>_> in_RDI;
  ToggleTiles *lastCommandPtr;
  Command *lastCommand;
  pointer in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar6;
  Command *this_00;
  _Head_base<0UL,_commands::ToggleTiles_*,_false> this_01;
  Board *in_stack_ffffffffffffffc8;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  type local_28;
  
  this_01._M_head_impl =
       (ToggleTiles *)
       in_RDI.
       super__Tuple_impl<0UL,_commands::ToggleTiles_*,_std::default_delete<commands::ToggleTiles>_>.
       super__Head_base<0UL,_commands::ToggleTiles_*,_false>._M_head_impl;
  sVar2 = std::
          deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
          ::size((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                  *)0x197b9b);
  if (sVar2 != 0) {
    this_00 = *(Command **)(in_RSI + 0xb18);
    pCVar3 = (Command *)
             std::
             deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
             ::size((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                     *)0x197bc2);
    if (this_00 == pCVar3) {
      std::
      deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
      ::back((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
              *)this_01._M_head_impl);
      local_28 = std::unique_ptr<Command,_std::default_delete<Command>_>::operator*
                           ((unique_ptr<Command,_std::default_delete<Command>_> *)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      uVar1 = (*local_28->_vptr_Command[3])();
      uVar6 = false;
      if ((uVar1 & 1) != 0) {
        local_30.__r = (rep)Command::getTimeSinceLastExecute(this_00);
        rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
        uVar6 = false;
        if (rVar4 < 1000) {
          uVar6 = std::type_info::operator==((type_info *)this_01._M_head_impl,(type_info *)this_00)
          ;
        }
      }
      if ((bool)uVar6 != false) {
        spdlog::debug<char[42]>((char (*) [42])0x197c6b);
        if (*(long *)(in_RSI + 0xb20) == *(long *)(in_RSI + 0xb18)) {
          uVar5 = std::numeric_limits<unsigned_long>::max();
          *(unsigned_long *)(in_RSI + 0xb20) = uVar5;
        }
        std::
        deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
        ::back((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                *)this_01._M_head_impl);
        std::unique_ptr<Command,_std::default_delete<Command>_>::release
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)0x197cad);
        std::
        deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
        ::pop_back((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                    *)CONCAT17(uVar6,in_stack_ffffffffffffffa0));
        *(long *)(in_RSI + 0xb18) = *(long *)(in_RSI + 0xb18) + -1;
        std::unique_ptr<commands::ToggleTiles,std::default_delete<commands::ToggleTiles>>::
        unique_ptr<std::default_delete<commands::ToggleTiles>,void>
                  ((unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_> *
                   )CONCAT17(uVar6,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
        return (__uniq_ptr_data<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>,_true,_true>
                )(__uniq_ptr_data<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>,_true,_true>
                  )in_RDI.
                   super__Tuple_impl<0UL,_commands::ToggleTiles_*,_std::default_delete<commands::ToggleTiles>_>
                   .super__Head_base<0UL,_commands::ToggleTiles_*,_false>._M_head_impl;
      }
    }
  }
  details::make_unique<commands::ToggleTiles,_Board_&,_bool,_0>(in_stack_ffffffffffffffc8,in_RSI);
  return (__uniq_ptr_data<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>,_true,_true>
          )(__uniq_ptr_data<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_commands::ToggleTiles_*,_std::default_delete<commands::ToggleTiles>_>
             .super__Head_base<0UL,_commands::ToggleTiles_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> Editor::makeCommand(Args&&... args) {
    if (editHistory_.size() > 0 && lastEditSize_ == editHistory_.size()) {
        // If the command has the same type as the previous one and happened
        // recently, we can just add on to it instead of building a new command.

        Command& lastCommand = *editHistory_.back();
        if (lastCommand.isGroupingAllowed() && lastCommand.getTimeSinceLastExecute().count() < 1000 && typeid(lastCommand) == typeid(T)) {
            spdlog::debug("Last command has same type, returning it.");
            if (savedEditSize_ == lastEditSize_) {
                savedEditSize_ = std::numeric_limits<size_t>::max();
            }
            auto lastCommandPtr = static_cast<T*>(editHistory_.back().release());
            editHistory_.pop_back();
            --lastEditSize_;
            return std::unique_ptr<T>(lastCommandPtr);
        }

        // FIXME: eventually we may want to replace the above typeid checking with a function that gets a command-type from an enum.
        // could use a string instead, then we don't need an enum that is aware of all the commands.
        // the command-type id could be passed as first argument to command ctor?
    }
    return details::make_unique<T>(std::forward<Args>(args)...);
}